

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

MIPMap * pbrt::MIPMap::CreateFromFile
                   (string *filename,MIPMapFilterOptions *options,WrapMode wrapMode,
                   ColorEncodingHandle *encoding,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  float *pfVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  Half *pHVar7;
  long lVar8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  RGBColorSpace *colorSpace;
  ImageChannelDesc rgbDesc;
  ImageChannelDesc rgbaDesc;
  ImageAndMetadata imageAndMetadata;
  WrapMode local_2ec;
  Allocator local_2e8;
  undefined1 local_2e0 [32];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  *local_2c0 [2];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_2b0;
  undefined1 local_2a8 [8];
  long *local_2a0 [2];
  long local_290;
  undefined1 local_288 [8];
  Half *local_280 [2];
  Half local_270 [4];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_268;
  MIPMapFilterOptions *local_248;
  long local_240;
  polymorphic_allocator<std::byte> local_238;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_230;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_200;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_1d0;
  ImageAndMetadata local_1c8;
  
  local_1d0.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  local_2ec = wrapMode;
  local_238.memoryResource = alloc.memoryResource;
  Image::Read(&local_1c8,filename,alloc,(ColorEncodingHandle *)&local_1d0);
  if ((int)local_1c8.image.channelNames.nStored == 1) goto LAB_0038bd12;
  local_2e0._0_8_ = local_2e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"R","");
  local_2c0[0] = &local_2b0;
  local_248 = options;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"G","");
  plVar4 = &local_290;
  local_2e8.memoryResource = alloc.memoryResource;
  local_2a0[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"B","");
  pHVar7 = local_270;
  local_280[0] = pHVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"A","");
  requestedChannels.n = 4;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0;
  Image::GetChannelDesc((ImageChannelDesc *)&local_200,&local_1c8.image,requestedChannels);
  lVar5 = -0x80;
  do {
    if (pHVar7 != *(Half **)(pHVar7 + -8)) {
      operator_delete(*(Half **)(pHVar7 + -8),*(long *)pHVar7 + 1);
    }
    pHVar7 = pHVar7 + -0x10;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  local_2e0._0_8_ = local_2e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"R","");
  local_2c0[0] = &local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"G","");
  alloc.memoryResource = local_2e8.memoryResource;
  local_2a0[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"B","");
  requestedChannels_00.n = 3;
  requestedChannels_00.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0;
  Image::GetChannelDesc((ImageChannelDesc *)&local_230,&local_1c8.image,requestedChannels_00);
  lVar5 = -0x60;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if (local_200.nStored == 0) {
    if (local_230.nStored == 0) {
      ErrorExit<std::__cxx11::string_const&>
                ("%s: image doesn\'t have R, G, and B channels",filename);
    }
    Image::SelectChannels((Image *)local_2e0,&local_1c8.image,(ImageChannelDesc *)&local_230,alloc);
    local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_2e0._8_4_;
    local_1c8.image.format = (PixelFormat)local_2e0._0_8_;
    local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = SUB84(local_2e0._0_8_,4);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_1c8.image.channelNames,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 0x10));
    local_1c8.image.encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_2b0.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&local_1c8.image.p8,
               (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_2a8)
    ;
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&local_1c8.image.p16,
               (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_288);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&local_1c8.image.p32,&local_268);
  }
  else {
    lVar5 = CONCAT44(local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                     local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
    if (0 < local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y) {
      bVar1 = true;
      lVar8 = 0;
      lVar6 = 0;
      do {
        local_240 = lVar6;
        if (0 < (int)lVar5) {
          lVar6 = 0;
          do {
            Image::GetChannels((ImageChannelValues *)local_2e0,&local_1c8.image,
                               (Point2i)(lVar8 + lVar6),(ImageChannelDesc *)&local_200,
                               (WrapMode2D)0x200000002);
            pfVar3 = (float *)(CONCAT44(local_2e0._12_4_,local_2e0._8_4_) + 0xc);
            if (CONCAT44(local_2e0._12_4_,local_2e0._8_4_) == 0) {
              pfVar3 = (float *)(local_2e0 + 0x1c);
            }
            bVar1 = (bool)(bVar1 & *pfVar3 == 1.0);
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                       local_2e0);
            lVar5 = CONCAT44(local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                             local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
        }
        alloc.memoryResource = local_2e8.memoryResource;
        lVar8 = lVar8 + 0x100000000;
        lVar6 = local_240 + 1;
      } while (lVar6 < lVar5 >> 0x20);
      if (!bVar1) {
        Image::SelectChannels
                  ((Image *)local_2e0,&local_1c8.image,(ImageChannelDesc *)&local_200,local_2e8);
        local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_2e0._8_4_;
        local_1c8.image.format = (PixelFormat)local_2e0._0_8_;
        local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = SUB84(local_2e0._0_8_,4);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_1c8.image.channelNames,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_2e0 + 0x10));
        local_1c8.image.encoding.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )local_2b0.bits;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  (&local_1c8.image.p8,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   local_2a8);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  (&local_1c8.image.p16,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_288);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&local_1c8.image.p32,&local_268);
        goto LAB_0038bcd0;
      }
    }
    Image::SelectChannels((Image *)local_2e0,&local_1c8.image,(ImageChannelDesc *)&local_230,alloc);
    local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_2e0._8_4_;
    local_1c8.image.format = (PixelFormat)local_2e0._0_8_;
    local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = SUB84(local_2e0._0_8_,4);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_1c8.image.channelNames,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2e0 + 0x10));
    local_1c8.image.encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_2b0.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&local_1c8.image.p8,
               (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_2a8)
    ;
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&local_1c8.image.p16,
               (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_288);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&local_1c8.image.p32,&local_268);
  }
LAB_0038bcd0:
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_268);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
            ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_288);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_2a8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2e0 + 0x10));
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_230);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_200);
  options = local_248;
LAB_0038bd12:
  local_2e0._0_8_ = ImageMetadata::GetColorSpace(&local_1c8.metadata);
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x38,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::MIPMap,pbrt::Image,pbrt::RGBColorSpace_const*&,pbrt::WrapMode&,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::MIPMapFilterOptions_const&>
            (&local_238,(MIPMap *)CONCAT44(extraout_var,iVar2),&local_1c8.image,
             (RGBColorSpace **)local_2e0,&local_2ec,&local_238,options);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_1c8.metadata.stringVectors._M_t);
  if (local_1c8.metadata.colorSpace.set == true) {
    local_1c8.metadata.colorSpace.set = false;
  }
  if (local_1c8.metadata.MSE.set == true) {
    local_1c8.metadata.MSE.set = false;
  }
  if (local_1c8.metadata.samplesPerPixel.set == true) {
    local_1c8.metadata.samplesPerPixel.set = false;
  }
  if (local_1c8.metadata.fullResolution.set == true) {
    local_1c8.metadata.fullResolution.set = false;
  }
  if (local_1c8.metadata.pixelBounds.set == true) {
    local_1c8.metadata.pixelBounds.set = false;
  }
  if (local_1c8.metadata.NDCFromWorld.set == true) {
    local_1c8.metadata.NDCFromWorld.set = false;
  }
  if (local_1c8.metadata.cameraFromWorld.set == true) {
    local_1c8.metadata.cameraFromWorld.set = false;
  }
  if (local_1c8.metadata.renderTimeSeconds.set == true) {
    local_1c8.metadata.renderTimeSeconds.set = false;
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_1c8.image.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
            (&local_1c8.image.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            (&local_1c8.image.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8.image.channelNames);
  return (MIPMap *)CONCAT44(extraout_var,iVar2);
}

Assistant:

MIPMap *MIPMap::CreateFromFile(const std::string &filename,
                               const MIPMapFilterOptions &options, WrapMode wrapMode,
                               ColorEncodingHandle encoding, Allocator alloc) {
    ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc, encoding);

    Image &image = imageAndMetadata.image;
    if (image.NChannels() != 1) {
        // Get the channels in a canonical order..
        ImageChannelDesc rgbaDesc = image.GetChannelDesc({"R", "G", "B", "A"});
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (rgbaDesc) {
            // Is alpha all ones?
            bool allOne = true;
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    if (image.GetChannels({x, y}, rgbaDesc)[3] != 1)
                        allOne = false;
            if (allOne)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                image = image.SelectChannels(rgbaDesc, alloc);
        } else {
            if (rgbDesc)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                ErrorExit("%s: image doesn't have R, G, and B channels", filename);
        }
    }

    const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();
    return alloc.new_object<MIPMap>(std::move(image), colorSpace, wrapMode, alloc,
                                    options);
}